

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMI_YES_NO_Unmarshal(TPMI_YES_NO *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMI_YES_NO *target_local;
  
  target_local._4_4_ = UINT8_Unmarshal(target,buffer,size);
  if (target_local._4_4_ == 0) {
    if (*target < 2) {
      target_local._4_4_ = 0;
    }
    else {
      target_local._4_4_ = 0x84;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMI_YES_NO_Unmarshal(TPMI_YES_NO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = BYTE_Unmarshal((BYTE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case NO:
        case YES:
            break;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}